

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slaqgs.c
# Opt level: O2

void slaqgs(SuperMatrix *A,float *r,float *c,float rowcnd,float colcnd,float amax,char *equed)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  char cVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  
  cVar6 = 'N';
  if ((0 < A->nrow) && (0 < A->ncol)) {
    pvVar2 = A->Store;
    lVar3 = *(long *)((long)pvVar2 + 8);
    fVar8 = smach("Safe minimum");
    fVar9 = smach("Precision");
    if ((rowcnd < 0.1) || ((amax < fVar8 / fVar9 || (1.0 / (fVar8 / fVar9) < amax)))) {
      uVar4 = 0;
      if (0 < A->ncol) {
        uVar4 = (ulong)(uint)A->ncol;
      }
      if (0.1 <= colcnd) {
        uVar7 = 0;
        while (uVar7 != uVar4) {
          lVar5 = uVar7 * 4;
          iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x18) + 4 + uVar7 * 4);
          uVar7 = uVar7 + 1;
          for (lVar5 = (long)*(int *)(*(long *)((long)pvVar2 + 0x18) + lVar5); lVar5 < iVar1;
              lVar5 = lVar5 + 1) {
            *(float *)(lVar3 + lVar5 * 4) =
                 r[*(int *)(*(long *)((long)pvVar2 + 0x10) + lVar5 * 4)] *
                 *(float *)(lVar3 + lVar5 * 4);
          }
        }
        cVar6 = 'R';
      }
      else {
        uVar7 = 0;
        while (uVar7 != uVar4) {
          fVar8 = c[uVar7];
          lVar5 = uVar7 * 4;
          iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x18) + 4 + uVar7 * 4);
          uVar7 = uVar7 + 1;
          for (lVar5 = (long)*(int *)(*(long *)((long)pvVar2 + 0x18) + lVar5); lVar5 < iVar1;
              lVar5 = lVar5 + 1) {
            *(float *)(lVar3 + lVar5 * 4) =
                 r[*(int *)(*(long *)((long)pvVar2 + 0x10) + lVar5 * 4)] * fVar8 *
                 *(float *)(lVar3 + lVar5 * 4);
          }
        }
        cVar6 = 'B';
      }
    }
    else if (colcnd < 0.1) {
      uVar7 = 0;
      uVar4 = (ulong)(uint)A->ncol;
      if (A->ncol < 1) {
        uVar4 = uVar7;
      }
      while (uVar7 != uVar4) {
        fVar8 = c[uVar7];
        lVar5 = uVar7 * 4;
        iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x18) + 4 + uVar7 * 4);
        uVar7 = uVar7 + 1;
        for (lVar5 = (long)*(int *)(*(long *)((long)pvVar2 + 0x18) + lVar5); lVar5 < iVar1;
            lVar5 = lVar5 + 1) {
          *(float *)(lVar3 + lVar5 * 4) = *(float *)(lVar3 + lVar5 * 4) * fVar8;
        }
      }
      cVar6 = 'C';
    }
  }
  *equed = cVar6;
  return;
}

Assistant:

void
slaqgs(SuperMatrix *A, float *r, float *c, 
	float rowcnd, float colcnd, float amax, char *equed)
{


#define THRESH    (0.1)
    
    /* Local variables */
    NCformat *Astore;
    float   *Aval;
    int_t i, j;
    int   irow;
    float large, small, cj;


    /* Quick return if possible */
    if (A->nrow <= 0 || A->ncol <= 0) {
	*(unsigned char *)equed = 'N';
	return;
    }

    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Initialize LARGE and SMALL. */
    small = smach("Safe minimum") / smach("Precision");
    large = 1. / small;

    if (rowcnd >= THRESH && amax >= small && amax <= large) {
	if (colcnd >= THRESH)
	    *(unsigned char *)equed = 'N';
	else {
	    /* Column scaling */
	    for (j = 0; j < A->ncol; ++j) {
		cj = c[j];
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    Aval[i] *= cj;
                }
	    }
	    *(unsigned char *)equed = 'C';
	}
    } else if (colcnd >= THRESH) {
	/* Row scaling, no column scaling */
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		irow = Astore->rowind[i];
		Aval[i] *= r[irow];
	    }
	*(unsigned char *)equed = 'R';
    } else {
	/* Row and column scaling */
	for (j = 0; j < A->ncol; ++j) {
	    cj = c[j];
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		irow = Astore->rowind[i];
		Aval[i] *= cj * r[irow];
	    }
	}
	*(unsigned char *)equed = 'B';
    }

    return;

}